

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O2

void loadGoData(QMultiHash<char,_QLatin1String> *types,QMultiHash<char,_QLatin1String> *keywords,
               QMultiHash<char,_QLatin1String> *builtin,QMultiHash<char,_QLatin1String> *literals,
               QMultiHash<char,_QLatin1String> *other)

{
  if (goDataInitialized == '\0') {
    initGoData();
    goDataInitialized = '\x01';
  }
  QMultiHash<char,_QLatin1String>::operator=(types,&go_types);
  QMultiHash<char,_QLatin1String>::operator=(keywords,&go_keywords);
  QMultiHash<char,_QLatin1String>::operator=(builtin,&go_builtin);
  QMultiHash<char,_QLatin1String>::operator=(literals,&go_literals);
  QMultiHash<char,_QLatin1String>::operator=(other,&go_other);
  return;
}

Assistant:

void loadGoData(QMultiHash<char, QLatin1String> &types,
                QMultiHash<char, QLatin1String> &keywords,
                QMultiHash<char, QLatin1String> &builtin,
                QMultiHash<char, QLatin1String> &literals,
                QMultiHash<char, QLatin1String> &other) {
    if (!goDataInitialized) {
        initGoData();
        goDataInitialized = true;
    }
    types = go_types;
    keywords = go_keywords;
    builtin = go_builtin;
    literals = go_literals;
    other = go_other;
}